

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarTextNavigator::updateDateLabel(QCalendarTextNavigator *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QPalette *pQVar7;
  QCalendarDateValidator *in_RDI;
  long in_FS_OFFSET;
  QRect newRect;
  QRect r;
  QSize s;
  QPalette p;
  int in_stack_ffffffffffffff68;
  ColorRole in_stack_ffffffffffffff6c;
  QWidget *this_00;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QCalendarDateValidator *this_01;
  QRect *r_00;
  QWidget *this_02;
  QCalendar in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->m_yearValidator).super_QCalendarDateSectionValidator.
      _vptr_QCalendarDateSectionValidator != (_func_int **)0x0) {
    this_01 = in_RDI;
    QBasicTimer::start((QBasicTimer *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (int)((ulong)in_RDI >> 0x20),
                       (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    this_00 = *(QWidget **)&(((QFrame *)&in_RDI->m_separators)->super_QWidget).super_QPaintDevice;
    QCalendarDateValidator::currentText(this_01,in_stack_ffffffffffffffe8);
    QLabel::setText((QLabel *)in_RDI,
                    (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    QString::~QString((QString *)0x517ade);
    (*(code *)((in_RDI->m_tokens).
               super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
               ._M_impl.super__Vector_impl_data._M_start)->validator[7].
              _vptr_QCalendarDateSectionValidator)();
    QWidget::geometry((QWidget *)
                      (in_RDI->m_yearValidator).super_QCalendarDateSectionValidator.
                      _vptr_QCalendarDateSectionValidator);
    r_00 = (QRect *)&DAT_aaaaaaaaaaaaaaaa;
    this_02 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    iVar3 = QSize::width((QSize *)0x517b68);
    iVar3 = (iVar2 - iVar3) / 2;
    iVar4 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    iVar5 = QSize::height((QSize *)0x517b94);
    iVar5 = (iVar4 - iVar5) / 2;
    iVar6 = QSize::width((QSize *)0x517bb2);
    QSize::height((QSize *)0x517bc0);
    QRect::QRect((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffff78),(int)((ulong)this_00 >> 0x20),
                 (int)this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    QWidget::setGeometry(this_02,r_00);
    pQVar7 = QWidget::palette(this_00);
    QPalette::QPalette((QPalette *)&stack0xffffffffffffffe8,(QPalette *)pQVar7);
    QWidget::window((QWidget *)CONCAT44(iVar3,iVar4));
    QWidget::palette(this_00);
    QPalette::brush((QPalette *)this_00,in_stack_ffffffffffffff6c);
    QPalette::setBrush((QPalette *)this_00,in_stack_ffffffffffffff6c,(QBrush *)0x517c60);
    iVar2 = (int)&stack0xffffffffffffffe8;
    QWidget::setPalette((QWidget *)CONCAT44(iVar6,iVar5),(QPalette *)CONCAT44(iVar3,iVar4));
    QWidget::raise((QWidget *)
                   (in_RDI->m_tokens).
                   super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                   ._M_impl.super__Vector_impl_data._M_start,iVar2);
    QWidget::show((QWidget *)CONCAT44(iVar3,iVar4));
    QPalette::~QPalette((QPalette *)&stack0xffffffffffffffe8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarTextNavigator::updateDateLabel()
{
    if (!m_widget)
        return;

    m_acceptTimer.start(m_editDelay, this);

    m_dateText->setText(m_dateValidator->currentText(m_calendar));

    QSize s = m_dateFrame->sizeHint();
    QRect r = m_widget->geometry(); // later, just the table section
    QRect newRect((r.width() - s.width()) / 2, (r.height() - s.height()) / 2, s.width(), s.height());
    m_dateFrame->setGeometry(newRect);
    // need to set palette after geometry update as phonestyle sets transparency
    // effect in move event.
    QPalette p = m_dateFrame->palette();
    p.setBrush(QPalette::Window, m_dateFrame->window()->palette().brush(QPalette::Window));
    m_dateFrame->setPalette(p);

    m_dateFrame->raise();
    m_dateFrame->show();
}